

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketManager.cpp
# Opt level: O2

void __thiscall SocketManager::SMMLF::server(SMMLF *this)

{
  SOCK __fd;
  SocketOnline *this_00;
  uint uVar1;
  int iVar2;
  string sStack_b8;
  char buffer [101];
  
  std::__cxx11::string::string((string *)&sStack_b8,(string *)this);
  server_init(&this->serv_sock,&sStack_b8,node_type + this->port);
  std::__cxx11::string::~string((string *)&sStack_b8);
  for (iVar2 = node_type; iVar2 < 2; iVar2 = iVar2 + 1) {
    __fd = accept_sock(this->serv_sock);
    this->sock = __fd;
    read(__fd,buffer,1);
    uVar1 = (uint)buffer[0];
    printf("Message form client %d: %c\n",(ulong)(uVar1 - 0x30),(ulong)uVar1);
    this_00 = (SocketOnline *)operator_new(0x28);
    SocketOnline::SocketOnline(this_00,uVar1 - 0x30,this->sock);
    *(SocketOnline **)((long)node_type * 0x18 + 0x12c520 + (long)(int)uVar1 * 8) = this_00;
    *(SOCK *)((long)this + (long)(int)uVar1 * 4 + -0x98) = this->sock;
  }
  return;
}

Assistant:

void SocketManager::SMMLF::server() {
    server_init(serv_sock, ip, port + node_type);
    char buffer[101];
    for (int i = node_type + 1; i < M; i++) {
        sock = accept_sock(serv_sock);
#ifdef UNIX_PLATFORM
        read(sock, buffer, 1);
#else
        recv(sock, buffer, 1, NULL);
#endif
        printf("Message form client %d: %c\n", buffer[0]-'0', buffer[0]);
        socket_io[node_type][buffer[0]-'0'] = new SocketOnline(buffer[0]-'0', sock);
        clnt_sock[buffer[0]-'0'] = sock;
    }
}